

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestGrow(void)

{
  bool bVar1;
  size_type sVar2;
  size_t reserveSize;
  OutputBuffer ob;
  lazy_ostream *in_stack_fffffffffffff748;
  char *reserveSize_00;
  basic_cstring<const_char> *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  begin *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  OutputBuffer *in_stack_fffffffffffff770;
  lazy_ostream *in_stack_fffffffffffff788;
  OutputBuffer *in_stack_fffffffffffff790;
  size_t line_num;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  unit_test_log_t *in_stack_fffffffffffff7a0;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  unit_test_log_t *in_stack_fffffffffffff7c0;
  undefined1 local_6a8 [24];
  undefined1 local_690 [56];
  basic_cstring<const_char> local_658;
  undefined1 local_648 [24];
  undefined1 local_630 [56];
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  undefined1 local_5c8 [56];
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  undefined1 local_560 [56];
  basic_cstring<const_char> local_528;
  undefined1 local_518 [24];
  undefined1 local_500 [56];
  basic_cstring<const_char> local_4c8;
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [56];
  basic_cstring<const_char> local_468;
  size_type local_458;
  basic_cstring<const_char> local_450;
  undefined1 local_440 [56];
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  undefined1 local_3d8 [56];
  basic_cstring<const_char> local_3a0;
  undefined1 local_390 [12];
  int local_384;
  basic_cstring<const_char> local_380;
  undefined1 local_370 [56];
  basic_cstring<const_char> local_338;
  undefined1 local_328 [24];
  undefined1 local_310 [56];
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  undefined1 local_2a8 [56];
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  undefined1 local_240 [56];
  basic_cstring<const_char> local_208;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [56];
  basic_cstring<const_char> local_1a8;
  undefined1 local_198 [24];
  undefined1 local_180 [56];
  basic_cstring<const_char> local_148;
  undefined1 local_134 [28];
  undefined1 local_118 [56];
  basic_cstring<const_char> local_e0;
  size_type local_d0;
  basic_cstring<const_char> local_c8;
  undefined1 local_b8 [56];
  basic_cstring<const_char> local_80 [5];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffff760,(const_string *)in_stack_fffffffffffff758,
             (size_t)in_stack_fffffffffffff750);
  boost::unit_test::unit_test_log_t::operator<<
            (in_stack_fffffffffffff7c0,
             (begin *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff758,
             (log_level)((ulong)in_stack_fffffffffffff750 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [9])in_stack_fffffffffffff750);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[9],_const_char_(&)[9]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[9],_const_char_(&)[9]>
                      *)0x227614);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffff750);
  avro::OutputBuffer::OutputBuffer
            (in_stack_fffffffffffff770,CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
            );
  addDataToBuffer(in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d0 = avro::OutputBuffer::size((OutputBuffer *)0x227702);
    in_stack_fffffffffffff758 = "kDefaultBlockSize";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)&avro::detail::kDefaultBlockSize;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b8,&local_c8,0x79,1,2,&local_d0,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22777b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_134 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_134._4_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x22784e);
    local_134._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_134;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_118,local_134 + 0xc,0x7a,1,2,local_134 + 4,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2278d3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_198 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_198._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x2279a6);
    local_198._0_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_198;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_180,local_198 + 8,0x7b,1,2,local_198 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227a28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1f8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1f8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x227afb);
    local_1f8._0_4_ = 1;
    in_stack_fffffffffffff758 = "1";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_1f8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1e0,local_1f8 + 8,0x7c,1,2,local_1f8 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227b7d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  addDataToBuffer(in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_260.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x227c64);
    local_260.m_begin = (iterator)0x1800;
    in_stack_fffffffffffff758 = "kDefaultBlockSize + kDefaultBlockSize/2";
    in_stack_fffffffffffff750 = &local_260;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_240,&local_250,0x81,1,2,&local_260.m_end,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227cea);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2c8.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x227dbd);
    local_2c8.m_begin = (iterator)0x800;
    in_stack_fffffffffffff758 = "kDefaultBlockSize/2";
    in_stack_fffffffffffff750 = &local_2c8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2a8,&local_2b8,0x82,1,2,&local_2c8.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227e43);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_328 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_328._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x227f16);
    local_328._0_4_ = 1;
    in_stack_fffffffffffff758 = "1";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_328;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_310,local_328 + 8,0x83,1,2,local_328 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227f98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_384 = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22806b);
    local_390._8_4_ = 2;
    in_stack_fffffffffffff758 = "2";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)(local_390 + 8);
    reserveSize_00 = "ob.numDataChunks()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_370,&local_380,0x84,1,2,&local_384);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2280ed);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  sVar2 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x228119);
  local_390._0_8_ = sVar2 + 0x2000;
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_fffffffffffff750,(size_type)reserveSize_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_3f8.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x228204);
    local_3f8.m_begin = (iterator)0x1800;
    in_stack_fffffffffffff758 = "kDefaultBlockSize + kDefaultBlockSize/2";
    in_stack_fffffffffffff750 = &local_3f8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3d8,&local_3e8,0x8a,1,2,&local_3f8.m_end,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22828a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_458 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x22835d);
    in_stack_fffffffffffff758 = "reserveSize";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_390;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_440,&local_450,0x8b,1,2,&local_458,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2283d7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_4b8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x2284aa);
    local_4b8._0_4_ = 2;
    in_stack_fffffffffffff758 = "2";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_4b8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4a0,local_4b8 + 8,0x8c,1,2,local_4b8 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22852c);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_518 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_518._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2285ff);
    local_518._0_4_ = 2;
    in_stack_fffffffffffff758 = "2";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_518;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_500,local_518 + 8,0x8d,1,2,local_518 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x228681);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  addDataToBuffer(in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_580.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x22876e);
    local_580.m_begin = (iterator)(local_390._0_8_ + 0x1801);
    in_stack_fffffffffffff758 = "kDefaultBlockSize + kDefaultBlockSize/2 + reserveSize +1";
    in_stack_fffffffffffff750 = &local_580;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_560,&local_570,0x91,1,2,&local_580.m_end,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2287f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (size_t)in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_fffffffffffff7a0 =
         (unit_test_log_t *)avro::OutputBuffer::freeSpace((OutputBuffer *)0x2288b9);
    local_5e8.m_begin = (iterator)0xfff;
    in_stack_fffffffffffff758 = "kDefaultBlockSize - 1";
    in_stack_fffffffffffff750 = &local_5e8;
    local_5e8.m_end = (iterator)in_stack_fffffffffffff7a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5c8,&local_5d8,0x92,1,2,&local_5e8.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x228939);
    in_stack_fffffffffffff79f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff79f);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               line_num,(const_string *)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_648 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_648._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x2289fa);
    local_648._0_4_ = 1;
    in_stack_fffffffffffff758 = "1";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_648;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_630,local_648 + 8,0x93,1,2,local_648 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x228a76);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               line_num,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_6a8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_6a8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x228b37);
    local_6a8._0_4_ = 4;
    in_stack_fffffffffffff758 = "4";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_6a8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_690,local_6a8 + 8,0x94,1,2,local_6a8 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x228bb3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x228bd9);
  return;
}

Assistant:

void TestGrow()
{
    BOOST_TEST_MESSAGE( "TestGrow");
    { 
        OutputBuffer ob;

        // add exactly one block
        addDataToBuffer(ob, kDefaultBlockSize);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(ob.numChunks(), 0);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 1);

        // add another block, half full
        addDataToBuffer(ob, kDefaultBlockSize/2);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        // reserve more capacity
        size_t reserveSize = ob.freeSpace() + 8192;
        ob.reserve(reserveSize);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        // fill beyond capacity
        addDataToBuffer(ob, reserveSize + 1);
        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2 + reserveSize +1);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize - 1);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 4);
    }
}